

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

JavascriptMethod __thiscall
Js::FunctionBody::EnsureDynamicInterpreterThunk
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  Type p_Var1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  JobProcessor *in_RAX;
  undefined4 *puVar6;
  JavascriptMethod p_Var7;
  JobProcessor *this_00;
  char *message;
  char *error;
  AutoCriticalSection local_28;
  AutoCriticalSection autocs;
  
  local_28.cs = (CriticalSection *)in_RAX;
  EnsureDynamicProfileInfo(this);
  bVar3 = FunctionProxy::HasValidEntryPoint((FunctionProxy *)this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xf21,"(HasValidEntryPoint())","HasValidEntryPoint()");
    if (!bVar3) goto LAB_006ce3b0;
    *puVar6 = 0;
  }
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) != 0) {
    uVar4 = GetByteCodeCount(this);
    if (uVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf22,"(!m_isWasmFunction || GetByteCodeCount() > 0)",
                                  "Wasm function should be parsed by this point");
      if (!bVar3) goto LAB_006ce3b0;
      *puVar6 = 0;
    }
  }
  bVar3 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk
                    ((JavascriptMethod)
                     (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod);
  if (bVar3) {
    p_Var7 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
    bVar3 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var7);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xf26,
                                  "(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))"
                                  ,
                                  "InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked())"
                                 );
      if (!bVar3) goto LAB_006ce3b0;
      *puVar6 = 0;
    }
    GenerateDynamicInterpreterThunk(this);
    p_Var7 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
    (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)p_Var7;
    goto LAB_006ce357;
  }
  p_Var1 = (entryPointInfo->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod;
  p_Var7 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
  bVar3 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var7);
  if (p_Var1 == ScriptContext::DebugProfileProbeThunk) {
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      error = 
      "(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))"
      ;
      message = 
      "InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked())"
      ;
      uVar4 = 0xf2e;
LAB_006ce31a:
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,uVar4,error,message);
      if (!bVar3) {
LAB_006ce3b0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  else {
    if (!bVar3) goto LAB_006ce357;
    this_00 = ThreadContext::GetJobProcessor
                        (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                         threadContext);
    bVar3 = JsUtil::JobProcessor::ProcessesInBackground(this_00);
    if (bVar3) {
      local_28.cs = (CriticalSection *)(this_00 + 1);
      CCLock::Enter((CCLock *)local_28.cs);
      p_Var7 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
      bVar3 = InterpreterStackFrame::IsDelayDynamicInterpreterThunk(p_Var7);
      if (bVar3) {
        BVar5 = IsIntermediateCodeGenThunk
                          ((JavascriptMethod)
                           ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                            m_defaultEntryPointInfo.ptr)->jsMethod);
        if (BVar5 == 0) {
          BVar5 = IsAsmJsCodeGenThunk((JavascriptMethod)
                                      ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                       m_defaultEntryPointInfo.ptr)->jsMethod);
          if (BVar5 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar6 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                        ,0xf3d,
                                        "(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())))"
                                        ,
                                        "IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo()))"
                                       );
            if (!bVar3) goto LAB_006ce3b0;
            *puVar6 = 0;
          }
        }
        GenerateDynamicInterpreterThunk(this);
      }
      AutoCriticalSection::~AutoCriticalSection(&local_28);
      goto LAB_006ce357;
    }
    BVar5 = IsIntermediateCodeGenThunk
                      ((JavascriptMethod)
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                        m_defaultEntryPointInfo.ptr)->jsMethod);
    if (BVar5 == 0) {
      BVar5 = IsAsmJsCodeGenThunk((JavascriptMethod)
                                  ((this->super_ParseableFunctionInfo).super_FunctionProxy.
                                   m_defaultEntryPointInfo.ptr)->jsMethod);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        error = 
        "(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())))"
        ;
        message = 
        "IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo()))"
        ;
        uVar4 = 0xf45;
        goto LAB_006ce31a;
      }
    }
  }
  GenerateDynamicInterpreterThunk(this);
LAB_006ce357:
  p_Var7 = FunctionProxy::GetOriginalEntryPoint_Unchecked((FunctionProxy *)this);
  return p_Var7;
}

Assistant:

JavascriptMethod FunctionBody::EnsureDynamicInterpreterThunk(FunctionEntryPointInfo* entryPointInfo)
    {
        // This may be first call to the function, make sure we have dynamic profile info
        //
        // We need to ensure dynamic profile info even if we didn't generate a dynamic interpreter thunk
        // This happens when we go through CheckCodeGen thunk, to DelayDynamicInterpreterThunk, to here
        // but the background codegen thread updated the entry point with the native entry point.
        this->EnsureDynamicProfileInfo();

        Assert(HasValidEntryPoint());
        AssertMsg(!m_isWasmFunction || GetByteCodeCount() > 0, "Wasm function should be parsed by this point");
        if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetEntryPoint(entryPointInfo)))
        {
            // We are not doing code gen on this function, just change the entry point directly
            Assert(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()));
            GenerateDynamicInterpreterThunk();
            this->SetEntryPoint(entryPointInfo, this->GetOriginalEntryPoint_Unchecked());
        }
        else if (this->GetEntryPoint(entryPointInfo) == ProfileEntryThunk)
        {
            // We are not doing codegen on this function, just change the entry point directly
            // Don't replace the profile entry thunk
            Assert(InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()));
            GenerateDynamicInterpreterThunk();
        }
        else if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))
        {
            JsUtil::JobProcessor * jobProcessor = this->GetScriptContext()->GetThreadContext()->GetJobProcessor();
            if (jobProcessor->ProcessesInBackground())
            {
                JsUtil::BackgroundJobProcessor * backgroundJobProcessor = static_cast<JsUtil::BackgroundJobProcessor *>(jobProcessor);
                AutoCriticalSection autocs(backgroundJobProcessor->GetCriticalSection());
                // Check again under lock
                if (InterpreterStackFrame::IsDelayDynamicInterpreterThunk(this->GetOriginalEntryPoint_Unchecked()))
                {
                    // If the original entry point is DelayDynamicInterpreterThunk then there must be a version of this
                    // function being codegen'd.
                    Assert(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())));
                    GenerateDynamicInterpreterThunk();
                }
            }
            else
            {
                // If the original entry point is DelayDynamicInterpreterThunk then there must be a version of this
                // function being codegen'd.
                Assert(IsIntermediateCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())) || IsAsmJsCodeGenThunk((JavascriptMethod)this->GetEntryPoint(this->GetDefaultEntryPointInfo())));
                GenerateDynamicInterpreterThunk();
            }
        }
        return this->GetOriginalEntryPoint_Unchecked();
    }